

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall
capnp::JsonCodec::decodeObject
          (JsonCodec *this,Reader input,StructSchema type,Orphanage orphanage,Builder output)

{
  Field fieldSchema;
  Reader fieldValue;
  ElementCount index;
  bool bVar1;
  StringPtr name;
  Reader field;
  Schema local_1c0;
  StructReader local_1b8;
  undefined8 local_188;
  WirePointer *pWStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  PointerReader local_148;
  PointerReader local_128;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  StructReader local_d8;
  ListReader local_a8;
  undefined8 local_70;
  WirePointer *pWStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1c0 = type.super_Schema.raw;
  if ((input._reader.dataSize < 0x10) || (*input._reader.data != 5)) {
    decodeObject();
  }
  else {
    bVar1 = input._reader.pointerCount == 0;
    local_128.pointer = input._reader.pointers;
    if (bVar1) {
      local_128.pointer = (WirePointer *)0x0;
    }
    local_128.nestingLimit = 0x7fffffff;
    if (!bVar1) {
      local_128.nestingLimit = input._reader.nestingLimit;
    }
    local_128.segment._0_4_ = 0;
    local_128.segment._4_4_ = 0;
    local_128.capTable._0_4_ = 0;
    local_128.capTable._4_4_ = 0;
    if (!bVar1) {
      local_128.segment._0_4_ = input._reader.segment._0_4_;
      local_128.segment._4_4_ = input._reader.segment._4_4_;
      local_128.capTable._0_4_ = input._reader.capTable._0_4_;
      local_128.capTable._4_4_ = input._reader.capTable._4_4_;
    }
    capnp::_::PointerReader::getList(&local_a8,&local_128,INLINE_COMPOSITE,(word *)0x0);
    if (local_a8.elementCount != 0) {
      index = 0;
      do {
        capnp::_::ListReader::getStructElement(&local_1b8,&local_a8,index);
        bVar1 = local_1b8.pointerCount == 0;
        local_148.pointer = local_1b8.pointers;
        if (bVar1) {
          local_148.pointer = (WirePointer *)0x0;
        }
        local_148.nestingLimit = local_1b8.nestingLimit;
        if (bVar1) {
          local_148.nestingLimit = 0x7fffffff;
        }
        local_148.segment._0_4_ = 0;
        local_148.segment._4_4_ = 0;
        local_148.capTable._0_4_ = 0;
        local_148.capTable._4_4_ = 0;
        if (!bVar1) {
          local_148.segment._0_4_ = local_1b8.segment._0_4_;
          local_148.segment._4_4_ = local_1b8.segment._4_4_;
          local_148.capTable._0_4_ = local_1b8.capTable._0_4_;
          local_148.capTable._4_4_ = local_1b8.capTable._4_4_;
        }
        name.content = (ArrayPtr<const_char>)
                       capnp::_::PointerReader::getBlob<capnp::Text>(&local_148,(void *)0x0,0);
        StructSchema::findFieldByName
                  ((Maybe<capnp::StructSchema::Field> *)&local_128,(StructSchema *)&local_1c0,name);
        if ((char)local_128.segment == '\x01') {
          local_188 = CONCAT44(local_128.capTable._4_4_,local_128.capTable._0_4_);
          local_178 = CONCAT44(local_128._28_4_,local_128.nestingLimit);
          local_40 = local_f0;
          uStack_38 = uStack_e8;
          local_50 = local_100;
          uStack_48 = uStack_f8;
          uStack_58 = uStack_108;
          pWStack_68 = local_128.pointer;
          pWStack_180 = local_128.pointer;
          uStack_170 = uStack_108;
          local_168 = local_100;
          uStack_160 = uStack_f8;
          local_128.pointer = local_1b8.pointers + 1;
          if (local_1b8.pointerCount < 2) {
            local_128.pointer = (WirePointer *)0x0;
          }
          local_158 = local_f0;
          uStack_150 = uStack_e8;
          local_128.segment._0_4_ = local_1b8.segment._0_4_;
          local_128.segment._4_4_ = local_1b8.segment._4_4_;
          local_128.capTable._0_4_ = local_1b8.capTable._0_4_;
          local_128.capTable._4_4_ = local_1b8.capTable._4_4_;
          local_128.nestingLimit = local_1b8.nestingLimit;
          if (local_1b8.pointerCount < 2) {
            local_128.segment._0_4_ = 0;
            local_128.segment._4_4_ = 0;
            local_128.capTable._0_4_ = 0;
            local_128.capTable._4_4_ = 0;
            local_128.nestingLimit = 0x7fffffff;
          }
          local_70 = local_188;
          local_60 = local_178;
          capnp::_::PointerReader::getStruct(&local_d8,&local_128,(word *)0x0);
          fieldSchema._8_8_ = pWStack_180;
          fieldSchema.parent.super_Schema.raw = (Schema)(Schema)local_188;
          fieldSchema.proto._reader.segment = (SegmentReader *)local_178;
          fieldSchema.proto._reader.capTable = (CapTableReader *)uStack_170;
          fieldSchema.proto._reader.data = (void *)local_168;
          fieldSchema.proto._reader.pointers = (WirePointer *)uStack_160;
          fieldSchema.proto._reader.dataSize = (undefined4)local_158;
          fieldSchema.proto._reader.pointerCount = local_158._4_2_;
          fieldSchema.proto._reader._38_2_ = local_158._6_2_;
          fieldSchema.proto._reader._40_8_ = uStack_150;
          fieldValue._reader.capTable = local_d8.capTable;
          fieldValue._reader.segment = local_d8.segment;
          fieldValue._reader.data = local_d8.data;
          fieldValue._reader.pointers = local_d8.pointers;
          fieldValue._reader.dataSize = local_d8.dataSize;
          fieldValue._reader.pointerCount = local_d8.pointerCount;
          fieldValue._reader._38_2_ = local_d8._38_2_;
          fieldValue._reader.nestingLimit = local_d8.nestingLimit;
          fieldValue._reader._44_4_ = local_d8._44_4_;
          decodeField(this,fieldSchema,fieldValue,orphanage,output);
        }
        index = index + 1;
      } while (local_a8.elementCount != index);
    }
  }
  return;
}

Assistant:

void JsonCodec::decodeObject(JsonValue::Reader input, StructSchema type, Orphanage orphanage, DynamicStruct::Builder output) const {
  KJ_REQUIRE(input.isObject(), "Expected object value") { return; }
  for (auto field: input.getObject()) {
    KJ_IF_MAYBE(fieldSchema, type.findFieldByName(field.getName())) {
      decodeField(*fieldSchema, field.getValue(), orphanage, output);
    } else {
      // Unknown json fields are ignored to allow schema evolution
    }
  }
}